

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O2

void __thiscall cppcms::rpc::json_rpc_server::~json_rpc_server(json_rpc_server *this)

{
  (this->super_application)._vptr_application = (_func_int **)&PTR__json_rpc_server_002b7a88;
  booster::hold_ptr<cppcms::rpc::json_rpc_server::_data>::~hold_ptr(&this->d);
  std::__cxx11::string::~string((string *)&this->smd_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->current_call_).
              super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
  ::~_Rb_tree(&(this->methods_)._M_t);
  application::~application(&this->super_application);
  return;
}

Assistant:

json_rpc_server::~json_rpc_server()
	{
	}